

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter.cxx
# Opt level: O3

void FileParse::trimTrailingZeros(string *str,bool useScientific)

{
  pointer pcVar1;
  size_type sVar2;
  ulong uVar3;
  undefined7 in_register_00000031;
  ulong uVar4;
  size_type sVar5;
  
  if ((int)CONCAT71(in_register_00000031,useScientific) == 0) {
    uVar4 = str->_M_string_length;
    if (uVar4 != 0) {
      uVar3 = uVar4;
      do {
        if ((str->_M_dataplus)._M_p[uVar3 - 1] != '0') {
          if (uVar4 < uVar3) goto LAB_001959fb;
          goto LAB_001959ac;
        }
        uVar3 = uVar3 - 1;
      } while (uVar3 != 0);
    }
    uVar3 = 0;
LAB_001959ac:
    str->_M_string_length = uVar3;
    (str->_M_dataplus)._M_p[uVar3] = '\0';
    pcVar1 = (str->_M_dataplus)._M_p;
    sVar5 = str->_M_string_length;
    if (pcVar1[sVar5 - 1] == '.') {
      uVar3 = sVar5 - 1;
      if (sVar5 == 0) {
        uVar4 = 0;
LAB_001959fb:
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",
                   uVar3,uVar4);
      }
      str->_M_string_length = uVar3;
      pcVar1[uVar3] = '\0';
    }
  }
  else {
    sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_first_of(str,"eE",0,2);
    sVar5 = 0xffffffffffffffff;
    if (str->_M_string_length != 0) {
      uVar4 = str->_M_string_length - 1;
      if (sVar2 - 1 <= uVar4) {
        uVar4 = sVar2 - 1;
      }
      uVar4 = uVar4 + 1;
      do {
        if ((str->_M_dataplus)._M_p[uVar4 - 1] != '0') {
          sVar5 = uVar4 - 1;
          if (uVar4 <= sVar2 && sVar2 - uVar4 != 0) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                      (str,uVar4,sVar2 - uVar4);
          }
          break;
        }
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
    }
    sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_first_of(str,".eE",sVar5,3);
    if (((sVar5 != 0xffffffffffffffff) && (sVar5 + 1 < str->_M_string_length)) &&
       ((byte)((str->_M_dataplus)._M_p[sVar5 + 1] | 0x20U) == 0x65)) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                (str,sVar5,1);
      return;
    }
  }
  return;
}

Assistant:

void trimTrailingZeros(std::string & str, bool useScientific)
    {
        if(useScientific)
        {
            // Find the exponent and trim zeros before it
            auto ePos = str.find_first_of("eE");
            auto lastNonZero = str.find_last_not_of('0', ePos - 1);
            if(lastNonZero != std::string::npos && lastNonZero + 1 < ePos)
            {
                str.erase(lastNonZero + 1, ePos - lastNonZero - 1);
            }
            // Remove the decimal point if it's directly before 'e' or 'E'
            auto dotEPos = str.find_first_of(".eE", lastNonZero);
            if (dotEPos != std::string::npos &&
               (dotEPos + 1 < str.size()) &&
               (str[dotEPos + 1] == 'e' || str[dotEPos + 1] == 'E'))
            {
                str.erase(dotEPos, 1);
            }

        }
        else
        {
            // Remove trailing zeros for non-scientific notation
            str.erase(str.find_last_not_of('0') + 1, std::string::npos);
            // Remove decimal point if no decimal part remains
            if(str.back() == '.')
            {
                str.erase(str.length() - 1);
            }
        }
    }